

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::OurReader::readValue(OurReader *this)

{
  anon_struct_4_2_14fb5ae2_for_bits_ aVar1;
  Value *this_00;
  ValueHolder *pVVar2;
  ValueHolder VVar3;
  Location pCVar4;
  _Elt_pointer ppVVar5;
  Location pCVar6;
  bool bVar7;
  size_type sVar8;
  _Elt_pointer ppVVar9;
  _Elt_pointer ppVVar10;
  double value;
  Value v;
  allocator<char> local_51;
  Token token;
  String local_38;
  
  sVar8 = std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::size
                    ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
  if ((this->features_).stackLimit_ < sVar8) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&v,"Exceeded stackLimit in readValue().",(allocator<char> *)&token);
    throwRuntimeError((String *)&v);
  }
  skipCommentTokens(this,&token);
  if ((this->collectComments_ == true) && ((this->commentsBefore_)._M_string_length != 0)) {
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar9 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this_00 = ppVVar9[-1];
    std::__cxx11::string::string((string *)&local_38,(string *)&this->commentsBefore_);
    Value::setComment(this_00,&local_38,commentBefore);
    std::__cxx11::string::~string((string *)&local_38);
    (this->commentsBefore_)._M_string_length = 0;
    *(this->commentsBefore_)._M_dataplus._M_p = '\0';
  }
  switch(token.type_) {
  case tokenObjectBegin:
    bVar7 = readObject(this,&token);
    goto LAB_00109aac;
  case tokenObjectEnd:
  case tokenArrayEnd:
  case tokenArraySeparator:
    if ((this->features_).allowDroppedNullPlaceholders_ != true) goto switchD_00109911_default;
    this->current_ = this->current_ + -1;
    Value::Value(&v,nullValue);
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar9 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pVVar2 = &ppVVar9[-1]->value_;
    aVar1 = *(anon_struct_4_2_14fb5ae2_for_bits_ *)(pVVar2 + 1);
    *(anon_struct_4_2_14fb5ae2_for_bits_ *)(pVVar2 + 1) = v.bits_;
    VVar3 = *pVVar2;
    *pVVar2 = v.value_;
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar10 = ppVVar9;
    if (ppVVar9 == ppVVar5) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar6 = this->begin_;
    pCVar4 = this->current_;
    ppVVar10[-1]->start_ = (ptrdiff_t)(pCVar4 + ~(ulong)pCVar6);
    if (ppVVar9 == ppVVar5) {
      ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar9[-1]->limit_ = (long)pCVar4 - (long)pCVar6;
    v.value_ = VVar3;
    v.bits_ = aVar1;
    goto LAB_00109bb8;
  case tokenArrayBegin:
    bVar7 = readArray(this,&token);
LAB_00109aac:
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar9 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar9[-1]->limit_ = (long)this->current_ - (long)this->begin_;
    goto LAB_00109bc4;
  case tokenString:
    bVar7 = decodeString(this,&token);
    goto LAB_00109bc4;
  case tokenNumber:
    bVar7 = decodeNumber(this,&token);
    goto LAB_00109bc4;
  case tokenTrue:
    bVar7 = true;
    goto LAB_00109b24;
  case tokenFalse:
    bVar7 = false;
LAB_00109b24:
    Value::Value(&v,bVar7);
    goto LAB_00109b29;
  case tokenNull:
    Value::Value(&v,nullValue);
    goto LAB_00109b29;
  case tokenNaN:
    value = NAN;
    break;
  case tokenPosInf:
    value = INFINITY;
    break;
  case tokenNegInf:
    value = -INFINITY;
    break;
  default:
switchD_00109911_default:
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_first;
    ppVVar10 = ppVVar9;
    if (ppVVar9 == ppVVar5) {
      ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    pCVar6 = this->begin_;
    ppVVar10[-1]->start_ = (long)token.start_ - (long)pCVar6;
    if (ppVVar9 == ppVVar5) {
      ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    ppVVar9[-1]->limit_ = (long)token.end_ - (long)pCVar6;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&v,"Syntax error: value, object or array expected.",&local_51);
    addError(this,(String *)&v,&token,(Location)0x0);
    std::__cxx11::string::~string((string *)&v);
    return false;
  }
  Value::Value(&v,value);
LAB_00109b29:
  ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar9 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pVVar2 = &ppVVar9[-1]->value_;
  aVar1 = *(anon_struct_4_2_14fb5ae2_for_bits_ *)(pVVar2 + 1);
  *(anon_struct_4_2_14fb5ae2_for_bits_ *)(pVVar2 + 1) = v.bits_;
  VVar3 = *pVVar2;
  *pVVar2 = v.value_;
  ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVVar10 = ppVVar9;
  if (ppVVar9 == ppVVar5) {
    ppVVar10 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pCVar6 = this->begin_;
  ppVVar10[-1]->start_ = (long)token.start_ - (long)pCVar6;
  if (ppVVar9 == ppVVar5) {
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar9[-1]->limit_ = (long)token.end_ - (long)pCVar6;
  v.value_ = VVar3;
  v.bits_ = aVar1;
LAB_00109bb8:
  Value::~Value(&v);
  bVar7 = true;
LAB_00109bc4:
  if (this->collectComments_ == true) {
    ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    this->lastValueEnd_ = this->current_;
    this->lastValueHasAComment_ = false;
    if (ppVVar9 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar9 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this->lastValue_ = ppVVar9[-1];
  }
  return bVar7;
}

Assistant:

bool OurReader::readValue() {
  //  To preserve the old behaviour we cast size_t to int.
  if (nodes_.size() > features_.stackLimit_)
    throwRuntimeError("Exceeded stackLimit in readValue().");
  Token token;
  skipCommentTokens(token);
  bool successful = true;

  if (collectComments_ && !commentsBefore_.empty()) {
    currentValue().setComment(commentsBefore_, commentBefore);
    commentsBefore_.clear();
  }

  switch (token.type_) {
  case tokenObjectBegin:
    successful = readObject(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenArrayBegin:
    successful = readArray(token);
    currentValue().setOffsetLimit(current_ - begin_);
    break;
  case tokenNumber:
    successful = decodeNumber(token);
    break;
  case tokenString:
    successful = decodeString(token);
    break;
  case tokenTrue: {
    Value v(true);
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenFalse: {
    Value v(false);
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenNull: {
    Value v;
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenNaN: {
    Value v(std::numeric_limits<double>::quiet_NaN());
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenPosInf: {
    Value v(std::numeric_limits<double>::infinity());
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenNegInf: {
    Value v(-std::numeric_limits<double>::infinity());
    currentValue().swapPayload(v);
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
  } break;
  case tokenArraySeparator:
  case tokenObjectEnd:
  case tokenArrayEnd:
    if (features_.allowDroppedNullPlaceholders_) {
      // "Un-read" the current token and mark the current value as a null
      // token.
      current_--;
      Value v;
      currentValue().swapPayload(v);
      currentValue().setOffsetStart(current_ - begin_ - 1);
      currentValue().setOffsetLimit(current_ - begin_);
      break;
    } // else, fall through ...
  default:
    currentValue().setOffsetStart(token.start_ - begin_);
    currentValue().setOffsetLimit(token.end_ - begin_);
    return addError("Syntax error: value, object or array expected.", token);
  }

  if (collectComments_) {
    lastValueEnd_ = current_;
    lastValueHasAComment_ = false;
    lastValue_ = &currentValue();
  }

  return successful;
}